

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::handleFtpCommandPASS(FtpSession *this,string *param)

{
  bool bVar1;
  allocator local_a9;
  string local_a8 [32];
  undefined4 local_88;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  shared_ptr<fineftp::FtpUser> user;
  allocator local_39;
  string local_38 [32];
  _Base_ptr local_18;
  string *param_local;
  FtpSession *this_local;
  
  local_18 = (_Base_ptr)param;
  param_local = (string *)this;
  bVar1 = ::std::operator!=(&this->last_command_,"USER");
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"Please specify username first",&local_39);
    sendFtpMessage(this,COMMANDS_BAD_SEQUENCE,(string *)local_38);
    ::std::__cxx11::string::~string(local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    UserDatabase::getUser
              ((UserDatabase *)local_60,(string *)this->user_database_,
               (string *)&this->username_for_login_);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
    if (bVar1) {
      std::shared_ptr<fineftp::FtpUser>::operator=
                (&this->logged_in_user_,(shared_ptr<fineftp::FtpUser> *)local_60);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_80,"Login successful",&local_81);
      sendFtpMessage(this,USER_LOGGED_IN,(string *)local_80);
      ::std::__cxx11::string::~string(local_80);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a8,"Failed to log in",&local_a9);
      sendFtpMessage(this,NOT_LOGGED_IN,(string *)local_a8);
      ::std::__cxx11::string::~string(local_a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    local_88 = 1;
    ::std::shared_ptr<fineftp::FtpUser>::~shared_ptr((shared_ptr<fineftp::FtpUser> *)local_60);
  }
  return;
}

Assistant:

void FtpSession::handleFtpCommandPASS(const std::string& param)
  {
    if (last_command_ != "USER")
    {
      sendFtpMessage(FtpReplyCode::COMMANDS_BAD_SEQUENCE, "Please specify username first");
      return;
    }
    else
    {
      auto user = user_database_.getUser(username_for_login_, param);
      if (user)
      {
        logged_in_user_ = user;
        sendFtpMessage(FtpReplyCode::USER_LOGGED_IN, "Login successful");
        return;
      }
      else
      {
        sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN, "Failed to log in");
        return;
      }
    }
  }